

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O0

void rhash_swap_copy_str_to_u32(void *to,int index,void *from,size_t length)

{
  uint uVar1;
  undefined1 *local_48;
  char *src_1;
  uint32_t *dst;
  uint32_t *end;
  uint32_t *src;
  size_t length_local;
  void *from_local;
  int index_local;
  void *to_local;
  
  if ((((long)(int)to | (ulong)from | (long)index | length) & 3) == 0) {
    src_1 = (char *)((long)to + (long)index);
    end = (uint32_t *)from;
    while (end < (uint32_t *)((long)from + length)) {
      uVar1 = *end;
      *(uint *)src_1 =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      src_1 = src_1 + 4;
      end = end + 1;
    }
  }
  else {
    local_48 = (undefined1 *)from;
    for (from_local._4_4_ = index; (ulong)(long)(int)from_local._4_4_ < (long)index + length;
        from_local._4_4_ = from_local._4_4_ + 1) {
      *(undefined1 *)((long)to + (long)(int)(from_local._4_4_ ^ 3)) = *local_48;
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

void rhash_swap_copy_str_to_u32(void* to, int index, const void* from, size_t length)
{
	/* if all pointers and length are 32-bits aligned */
	if ( 0 == (( (int)((char*)to - (char*)0) | ((char*)from - (char*)0) | index | length ) & 3) ) {
		/* copy memory as 32-bit words */
		const uint32_t* src = (const uint32_t*)from;
		const uint32_t* end = (const uint32_t*)((const char*)src + length);
		uint32_t* dst = (uint32_t*)((char*)to + index);
		while (src < end) *(dst++) = bswap_32( *(src++) );
	} else {
		const char* src = (const char*)from;
		for (length += index; (size_t)index < length; index++) ((char*)to)[index ^ 3] = *(src++);
	}
}